

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::replace(CBString *this,int pos,int len,char *s,uchar cfill)

{
  CBString *this_00;
  int iVar1;
  CBStringException *pCVar2;
  size_t sVar3;
  int local_1d4;
  allocator local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  CBStringException bstr__cppwrapper_exception_3;
  allocator local_139;
  string local_138;
  undefined1 local_118 [8];
  CBStringException bstr__cppwrapper_exception_2;
  string local_e8;
  undefined1 local_c8 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_89;
  string local_88;
  undefined1 local_68 [8];
  CBStringException bstr__cppwrapper_exception;
  size_t q;
  tagbstring t;
  uchar cfill_local;
  char *s_local;
  int len_local;
  int pos_local;
  CBString *this_local;
  
  t.data._7_1_ = cfill;
  if ((this->super_tagbstring).mlen < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"CBString::Write protection error",&local_89);
    CBStringException::CBStringException((CBStringException *)local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,(CBStringException *)local_68);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if ((s == (char *)0x0) || ((pos | len) < 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e8,"CBString::Failure in replace",
               (allocator *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
    CBStringException::CBStringException((CBStringException *)local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,(CBStringException *)local_c8);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (pos + len < (this->super_tagbstring).slen) {
    if ((uint)((int)(this->super_tagbstring).data - (int)s) < (uint)(this->super_tagbstring).slen) {
      this_00 = (CBString *)((long)&bstr__cppwrapper_exception_3.msg.field_2 + 8);
      CBString(this_00,s);
      replace(this,pos,len,this_00,t.data._7_1_);
      ~CBString((CBString *)((long)&bstr__cppwrapper_exception_3.msg.field_2 + 8));
    }
    else {
      bstr__cppwrapper_exception.msg.field_2._8_8_ = strlen(s);
      if (((ulong)(long)len < (ulong)bstr__cppwrapper_exception.msg.field_2._8_8_) || (len < 0)) {
        if (0x7ffffffe <
            (ulong)(((long)(this->super_tagbstring).slen +
                    bstr__cppwrapper_exception.msg.field_2._8_8_) - (long)len)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1a0,"CBString::Failure in replace, result too long.",
                     &local_1a1);
          CBStringException::CBStringException((CBStringException *)local_180,&local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
          pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
          CBStringException::CBStringException(pCVar2,(CBStringException *)local_180);
          __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
        }
        alloc(this,((this->super_tagbstring).slen +
                   (int)bstr__cppwrapper_exception.msg.field_2._8_8_) - len);
        if ((this->super_tagbstring).data == (uchar *)0x0) {
          return;
        }
      }
      if ((int)bstr__cppwrapper_exception.msg.field_2._8_8_ != len) {
        memmove((this->super_tagbstring).data +
                bstr__cppwrapper_exception.msg.field_2._8_8_ + (long)pos,
                (this->super_tagbstring).data + (long)len + (long)pos,
                (long)((this->super_tagbstring).slen - (pos + len)));
      }
      memcpy((this->super_tagbstring).data + pos,s,bstr__cppwrapper_exception.msg.field_2._8_8_);
      (this->super_tagbstring).slen =
           ((int)bstr__cppwrapper_exception.msg.field_2._8_8_ - len) + (this->super_tagbstring).slen
      ;
      (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
    }
  }
  else {
    t._0_8_ = s;
    if (s == (char *)0x0) {
      local_1d4 = 0;
    }
    else {
      sVar3 = strlen(s);
      local_1d4 = (int)sVar3;
    }
    q._4_4_ = local_1d4;
    q._0_4_ = 0xffffffff;
    iVar1 = bsetstr(&this->super_tagbstring,pos,(const_bstring)&q,t.data._7_1_);
    if (iVar1 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_138,"CBString::Failure in replace",&local_139);
      CBStringException::CBStringException((CBStringException *)local_118,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar2,(CBStringException *)local_118);
      __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    if (pos + q._4_4_ < (this->super_tagbstring).slen) {
      (this->super_tagbstring).slen = pos + q._4_4_;
      (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
    }
  }
  return;
}

Assistant:

void CBString::replace (int pos, int len, const char * s, unsigned char cfill) {
struct tagbstring t;
size_t q;

	if (mlen <= 0) bstringThrow ("Write protection error");
	if (NULL == s || (pos|len) < 0) {
		bstringThrow ("Failure in replace");
	} else {
		if (pos + len >= slen) {
			cstr2tbstr (t, s);
			if (BSTR_ERR == bsetstr (this, pos, &t, cfill)) {
				bstringThrow ("Failure in replace");
			} else if (pos + t.slen < slen) {
				slen = pos + t.slen;
				data[slen] = '\0';
			}
		} else {

			/* Aliasing case */
			if ((unsigned int) (data - (unsigned char *) s) < (unsigned int) slen) {
				replace (pos, len, CBString(s), cfill);
				return;
			}

			if ((q = strlen (s)) > (size_t) len || len < 0) {
				if (slen + q - len >= INT_MAX) bstringThrow ("Failure in replace, result too long.");
				alloc ((int) (slen + q - len));
				if (NULL == data) return;
			}
			if ((int) q != len) bstr__memmove (data + pos + q, data + pos + len, slen - (pos + len));
			bstr__memcpy (data + pos, s, q);
			slen += ((int) q) - len;
			data[slen] = '\0';
		}
	}
}